

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O3

int __thiscall brown::App::appInit(App *this)

{
  int iVar1;
  SDL_Window *pSVar2;
  SDL_Renderer *pSVar3;
  SDL_Texture *pSVar4;
  int iVar5;
  
  iVar1 = SDL_Init(0x21);
  iVar5 = -1;
  if (iVar1 == 0) {
    pSVar2 = (SDL_Window *)
             SDL_CreateWindow("PlotSim",0x1fff0000,0x1fff0000,this->xres,this->yres,0x20);
    this->window = pSVar2;
    if (pSVar2 == (SDL_Window *)0x0) {
      SDL_Quit();
    }
    else {
      iVar5 = -1;
      pSVar3 = (SDL_Renderer *)SDL_CreateRenderer(pSVar2,0xffffffff,0);
      this->renderer = pSVar3;
      if (pSVar3 == (SDL_Renderer *)0x0) {
        SDL_Quit();
        SDL_DestroyWindow(this->window);
      }
      else {
        pSVar4 = (SDL_Texture *)SDL_CreateTexture(pSVar3,0x16362004,1,this->xres,this->yres);
        this->texture = pSVar4;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int App::appInit() {
    /* Init SDL */
    if (SDL_Init(SDL_INIT_VIDEO|SDL_INIT_TIMER) != 0) {
        return -1;
    }

    /* Create window and renderer */
    window = SDL_CreateWindow(WINDOW_NAME_, SDL_WINDOWPOS_UNDEFINED, SDL_WINDOWPOS_UNDEFINED, xres, yres, SDL_WINDOW_RESIZABLE);
    if (window == nullptr) {
        SDL_Quit();
        return -1;
    }
    renderer = SDL_CreateRenderer(window,-1,0);
    if (renderer == nullptr) {
        SDL_Quit();
        SDL_DestroyWindow(window);
        return -1;
    }

    /* Create VRAM texture */
    texture = SDL_CreateTexture(renderer, SDL_PIXELFORMAT_ARGB8888, SDL_TEXTUREACCESS_STREAMING, xres, yres);

    return 0;
}